

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine
          (BuiltStyledStreamWriter *this,Value *root)

{
  size_type sVar1;
  ostream *poVar2;
  long lVar3;
  long *plVar4;
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  _Var5;
  ulong *puVar6;
  ulong *local_68;
  long local_60;
  ulong local_58;
  long lStack_50;
  long *local_48 [2];
  long local_38 [2];
  
  if ((this->cs_ != None) &&
     (_Var5._M_head_impl =
           (root->comments_).ptr_._M_t.
           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           .
           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           ._M_head_impl,
     _Var5._M_head_impl !=
     (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL> *)
     0x0)) {
    sVar1 = *(size_type *)((long)(_Var5._M_head_impl)->_M_elems + 0x28);
    if (sVar1 != 0) {
      poVar2 = (this->super_StreamWriter).sout_;
      lVar3 = *(long *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)(_Var5._M_head_impl)->_M_elems + 0x20))->_M_dataplus;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>((string *)local_48,lVar3,sVar1 + lVar3);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_48,0,(char *)0x0,0x13b8d4);
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_58 = *puVar6;
        lStack_50 = plVar4[3];
        local_68 = &local_58;
      }
      else {
        local_58 = *puVar6;
        local_68 = (ulong *)*plVar4;
      }
      local_60 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_68,local_60);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      _Var5._M_head_impl =
           (root->comments_).ptr_._M_t.
           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           .
           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           ._M_head_impl;
      if (_Var5._M_head_impl ==
          (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           *)0x0) {
        return;
      }
    }
    if ((_Var5._M_head_impl)->_M_elems[2]._M_string_length != 0) {
      writeIndent(this);
      poVar2 = (this->super_StreamWriter).sout_;
      _Var5._M_head_impl =
           (root->comments_).ptr_._M_t.
           super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
           .
           super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
           ._M_head_impl;
      if (_Var5._M_head_impl ==
          (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           *)0x0) {
        local_68 = &local_58;
        local_60 = 0;
        local_58 = local_58 & 0xffffffffffffff00;
      }
      else {
        local_68 = &local_58;
        lVar3 = *(long *)&((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)(_Var5._M_head_impl)->_M_elems + 0x40))->_M_dataplus;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,lVar3,
                   *(size_type *)((long)(_Var5._M_head_impl)->_M_elems + 0x48) + lVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_68,local_60);
      if (local_68 != &local_58) {
        operator_delete(local_68,local_58 + 1);
      }
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine(
    Value const& root) {
  if (cs_ == CommentStyle::None)
    return;
  if (root.hasComment(commentAfterOnSameLine))
    *sout_ << " " + root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *sout_ << root.getComment(commentAfter);
  }
}